

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

void predict_or_learn_bandit_adf<true>(warm_cb *data,multi_learner *base,example *ec,int ec_type)

{
  action_score *paVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  vw_exception *this;
  wclass *pwVar6;
  float fVar7;
  stringstream __msg;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  uVar4 = predict_bandit_adf(data,base,ec);
  paVar1 = (data->a_s_adf)._begin;
  uVar5 = paVar1[uVar4].action + 1;
  (data->cl_adf).action = uVar5;
  (data->cl_adf).probability = paVar1[uVar4].score;
  if (uVar5 == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_198,"No action with non-zero probability found!",0x2a);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
               ,0x1cb,&sStack_1c8);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar3 = (ec->l).cs.costs._end;
  if (pwVar2 == pwVar3) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    do {
      pwVar6 = pwVar2 + 1;
      if (pwVar2->class_index == uVar5) {
        fVar7 = pwVar2->x;
        break;
      }
      pwVar2 = pwVar6;
    } while (pwVar6 != pwVar3);
  }
  (data->cl_adf).cost = (data->loss1 - data->loss0) * fVar7 + data->loss0;
  if (ec_type == 2) {
    accumu_costs_iv_adf(data,base,ec);
  }
  if (*(char *)((long)&(data->cb_label).costs._begin + ((ulong)(ec_type == 1) ^ 0x85)) == '\x01') {
    learn_bandit_adf(data,base,ec,ec_type);
  }
  (ec->pred).scalar = (float)(data->cl_adf).action;
  return;
}

Assistant:

void predict_or_learn_bandit_adf(warm_cb& data, multi_learner& base, example& ec, int ec_type)
{
	uint32_t chosen_action = predict_bandit_adf(data, base, ec);

	auto& cl = data.cl_adf;
	auto& a_s = data.a_s_adf;
	cl.action = a_s[chosen_action].action + 1;
	cl.probability = a_s[chosen_action].score;

	if(!cl.action)
		THROW("No action with non-zero probability found!");

	if (use_cs)
		cl.cost = loss_cs(data, ec.l.cs.costs, cl.action);
	else
		cl.cost = loss(data, ec.l.multi.label, cl.action);

	if (ec_type == INTERACTION)
		accumu_costs_iv_adf(data, base, ec);

	if (ind_update(data, ec_type))
		learn_bandit_adf(data, base, ec, ec_type);

	ec.pred.multiclass = cl.action;
}